

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          Dimension dimension,Column_settings *colSettings)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar1;
  uint pivot;
  size_type __n;
  reference puVar2;
  const_iterator cStack_68;
  ID_index id;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  Index i;
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>
  local_39;
  value_type local_38;
  anon_class_8_1_c18eeb02 local_30;
  Column_settings *local_28;
  Column_settings *colSettings_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  Dimension dimension_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices_local;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *this_local;
  
  local_28 = colSettings;
  colSettings_local._4_4_ = dimension;
  pvStack_18 = nonZeroRowIndices;
  nonZeroRowIndices_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  Dummy_row_access::Dummy_row_access((Dummy_row_access *)this);
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
              *)this,colSettings_local._4_4_);
  local_30.nonZeroRowIndices = pvStack_18;
  pivot = Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          ::Vector_column<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
          anon_class_8_1_c18eeb02::operator()(&local_30);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,pivot,0);
  __n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_18);
  local_38 = (value_type)0x0;
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>
  ::allocator(&local_39);
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
            *)(this + 8),__n,&local_38,&local_39);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>
  ::~allocator(&local_39);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)(this + 0x20));
  this_00 = pvStack_18;
  *(undefined8 *)(this + 0x58) = 0;
  *(Column_settings **)(this + 0x60) = local_28;
  __range4._0_4_ = 0;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvStack_18);
  cStack_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff98);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
    ::_update_entry((Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                     *)this,*puVar2,(Index)__range4);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
    __range4._0_4_ = (Index)__range4 + 1;
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(const Container& nonZeroRowIndices,
                                                   Dimension dimension,
                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}